

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::CBString(CBString *this,CBString *b)

{
  int iVar1;
  uchar *__dest;
  CBStringException *this_00;
  size_t __n;
  allocator local_69;
  string local_68;
  CBStringException bstr__cppwrapper_exception;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_00180870;
  iVar1 = (b->super_tagbstring).slen;
  __n = (size_t)iVar1;
  (this->super_tagbstring).data = (uchar *)0x0;
  (this->super_tagbstring).slen = iVar1;
  (this->super_tagbstring).mlen = iVar1 + 1U;
  if (-1 < (long)__n) {
    __dest = (uchar *)malloc((ulong)(iVar1 + 1U));
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,(b->super_tagbstring).data,__n);
      __dest[__n] = '\0';
      return;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_68,"CBString::Failure in (CBString) constructor",&local_69);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const CBString& b) {
	slen = b.slen;
	mlen = slen + 1;
	data = NULL;
	if (mlen > 0) data = (unsigned char *) bstr__alloc (mlen);
	if (!data) {
		bstringThrow ("Failure in (CBString) constructor");
	} else {
		bstr__memcpy (data, b.data, slen);
		data[slen] = '\0';
	}
}